

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.cpp
# Opt level: O3

RGB __thiscall
RayTracerTriangles::processPixel(RayTracerTriangles *this,Segment *ray,int recursionLevel)

{
  RGB RVar1;
  Triangle local_d8;
  FindResult local_98;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_98.exists = false;
  local_98.triangle.normal.x = 0.0;
  local_98.triangle.normal.y = 0.0;
  local_98.triangle.normal.z = 0.0;
  local_98.triangle.reflectionCoefficient = 0.1;
  local_98.triangle.colorX.r = '\0';
  local_98.triangle.colorX.g = '\0';
  local_98.triangle.colorX.b = '\0';
  local_98.triangle.colorY.r = '\0';
  local_98.triangle.colorY.g = '\0';
  local_98.triangle.colorY.b = '\0';
  local_98.triangle.colorZ.r = '\0';
  local_98.triangle.colorZ.g = '\0';
  local_98.triangle.colorZ.b = '\0';
  if (this->kdTree != (KdNode *)0x0) {
    local_38._0_4_ = (ray->b).y;
    local_38._4_4_ = (ray->b).z;
    local_48._0_4_ = (ray->a).x;
    local_48._4_4_ = (ray->a).y;
    uStack_40 = *(undefined8 *)&(ray->a).z;
    local_d8.normal.x = 0.0;
    local_d8.normal.y = 0.0;
    local_d8.normal.z = 0.0;
    local_d8.reflectionCoefficient = 0.1;
    local_d8.x.x = 0.0;
    local_d8.x.y = 0.0;
    local_d8.x.z = 0.0;
    local_d8.y.x = 0.0;
    local_d8.y.y = 0.0;
    local_d8.y.z = 0.0;
    local_d8.z._0_5_ = 0;
    local_d8.z.y._1_3_ = 0;
    local_d8.z.z = 0.0;
    local_d8.colorX.r = '\0';
    local_d8.colorX.g = '\0';
    local_d8.colorX.b = '\0';
    local_d8.colorY.r = '\0';
    local_d8.colorY.g = '\0';
    local_d8.colorY.b = '\0';
    local_d8.colorZ.r = '\0';
    local_d8.colorZ.g = '\0';
    local_d8.colorZ.b = '\0';
    KdNode::find(&local_98,this->kdTree,*ray,&local_d8,0,1.1754944e-38,3.4028235e+38);
    if (local_98.exists != false) {
      RVar1 = processPixelOnTriangle(this,&ray->a,&local_98.point,&local_98.triangle,recursionLevel)
      ;
      return RVar1;
    }
  }
  return (this->super_RayTracerBase).config.super_BaseConfig.background;
}

Assistant:

RGB RayTracerTriangles::processPixel(Segment const& ray, int recursionLevel)
{
  FindResult triangleIntersec;
  if (kdTree != nullptr)
    triangleIntersec = kdTree->find(ray, Triangle{{0, 0, 0}, {0, 0, 0}, {0, 0, 0}}, 0, std::numeric_limits<float>::min(), std::numeric_limits<float>::max());
  if (triangleIntersec.exists == false)
    return processPixelOnBackground();

  return processPixelOnTriangle(ray.a, triangleIntersec.point, triangleIntersec.triangle,
                                recursionLevel);
}